

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-alloc-cb-fail.c
# Opt level: O3

int run_test_udp_alloc_cb_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uv_udp_t *puVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  uv_udp_t *unaff_RBX;
  uv_udp_t *puVar5;
  code *pcVar6;
  uv_udp_t *puVar7;
  char *pcVar8;
  int in_R8D;
  sockaddr_in addr;
  uv_udp_send_t req;
  undefined1 auStack_198 [16];
  uv_udp_t *puStack_188;
  undefined1 auStack_168 [24];
  uv_close_cb local_150;
  uv_udp_t local_148;
  
  puVar7 = (uv_udp_t *)auStack_168;
  pcVar8 = "0.0.0.0";
  puVar5 = (uv_udp_t *)0x23a3;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_168);
  if (iVar1 == 0) {
    puVar3 = (uv_udp_t *)uv_default_loop();
    puVar5 = &server;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_00186825;
    puVar3 = &server;
    iVar1 = uv_udp_bind(&server,auStack_168,0);
    if (iVar1 != 0) goto LAB_0018682a;
    puVar3 = &server;
    pcVar6 = sv_alloc_cb;
    iVar1 = uv_udp_recv_start(&server,sv_alloc_cb,sv_recv_cb);
    puVar7 = (uv_udp_t *)pcVar6;
    if (iVar1 != 0) goto LAB_0018682f;
    puVar3 = (uv_udp_t *)0x1a4e6a;
    puVar7 = (uv_udp_t *)0x23a3;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_168);
    if (iVar1 != 0) goto LAB_00186834;
    puVar3 = (uv_udp_t *)uv_default_loop();
    puVar7 = &client;
    iVar1 = uv_udp_init();
    if (iVar1 != 0) goto LAB_00186839;
    join_0x00000010_0x00000000_ = uv_buf_init("PING",4);
    puVar7 = &client;
    puVar3 = &local_148;
    in_R8D = (int)auStack_168;
    iVar1 = uv_udp_send(puVar3,&client,auStack_168 + 0x10,1,auStack_168,cl_send_cb);
    if (iVar1 != 0) goto LAB_0018683e;
    if (close_cb_called != 0) goto LAB_00186843;
    if (cl_send_cb_called != 0) goto LAB_00186848;
    if (cl_recv_cb_called != 0) goto LAB_0018684d;
    if (sv_send_cb_called != 0) goto LAB_00186852;
    if (sv_recv_cb_called != 0) goto LAB_00186857;
    puVar3 = (uv_udp_t *)uv_default_loop();
    puVar7 = (uv_udp_t *)0x0;
    uv_run();
    if (cl_send_cb_called != 1) goto LAB_0018685c;
    if (cl_recv_cb_called != 1) goto LAB_00186861;
    if (sv_send_cb_called != 1) goto LAB_00186866;
    if (sv_recv_cb_called != 1) goto LAB_0018686b;
    if (close_cb_called != 2) goto LAB_00186870;
    unaff_RBX = (uv_udp_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    puVar7 = (uv_udp_t *)0x0;
    uv_run(unaff_RBX);
    puVar3 = (uv_udp_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_udp_alloc_cb_fail_cold_1();
    puVar3 = (uv_udp_t *)pcVar8;
LAB_00186825:
    puVar7 = puVar5;
    run_test_udp_alloc_cb_fail_cold_2();
LAB_0018682a:
    run_test_udp_alloc_cb_fail_cold_3();
LAB_0018682f:
    run_test_udp_alloc_cb_fail_cold_4();
LAB_00186834:
    run_test_udp_alloc_cb_fail_cold_5();
LAB_00186839:
    run_test_udp_alloc_cb_fail_cold_6();
LAB_0018683e:
    run_test_udp_alloc_cb_fail_cold_7();
LAB_00186843:
    run_test_udp_alloc_cb_fail_cold_8();
LAB_00186848:
    run_test_udp_alloc_cb_fail_cold_9();
LAB_0018684d:
    run_test_udp_alloc_cb_fail_cold_10();
LAB_00186852:
    run_test_udp_alloc_cb_fail_cold_11();
LAB_00186857:
    run_test_udp_alloc_cb_fail_cold_12();
LAB_0018685c:
    run_test_udp_alloc_cb_fail_cold_13();
LAB_00186861:
    run_test_udp_alloc_cb_fail_cold_14();
LAB_00186866:
    run_test_udp_alloc_cb_fail_cold_15();
LAB_0018686b:
    run_test_udp_alloc_cb_fail_cold_16();
LAB_00186870:
    run_test_udp_alloc_cb_fail_cold_17();
  }
  run_test_udp_alloc_cb_fail_cold_18();
  puVar5 = (uv_udp_t *)CONCAT71(0x52e4,puVar3 == &client || puVar3 == &server);
  if (puVar3 == &client || puVar3 == &server) {
    *extraout_RDX = sv_alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x52e560;
  }
  sv_alloc_cb_cold_1();
  puStack_188 = unaff_RBX;
  if ((long)puVar7 < 0) {
    sv_recv_cb_cold_10();
    puVar5 = unaff_RBX;
LAB_00186996:
    sv_recv_cb_cold_1();
LAB_0018699b:
    sv_recv_cb_cold_2();
LAB_001869a0:
    sv_recv_cb_cold_8();
LAB_001869a5:
    sv_recv_cb_cold_3();
LAB_001869aa:
    sv_recv_cb_cold_4();
LAB_001869af:
    sv_recv_cb_cold_5();
LAB_001869b4:
    puVar3 = puVar7;
    sv_recv_cb_cold_7();
LAB_001869b9:
    sv_recv_cb_cold_6();
    puVar7 = puVar3;
  }
  else {
    if (puVar7 != (uv_udp_t *)0x0) {
      if (puVar3 != &client && puVar3 != &server) goto LAB_00186996;
      if (in_R8D != 0) goto LAB_0018699b;
      if (puVar5 == (uv_udp_t *)0x0) goto LAB_001869a0;
      if (puVar7 != (uv_udp_t *)0x4) goto LAB_001869a5;
      if (*(int *)*extraout_RDX_00 != 0x474e4950) goto LAB_001869aa;
      iVar1 = uv_udp_recv_stop(puVar3);
      if (iVar1 != 0) goto LAB_001869af;
      pvVar4 = malloc(0x140);
      if (pvVar4 == (void *)0x0) goto LAB_001869b4;
      auStack_198 = uv_buf_init("PONG",4);
      iVar1 = uv_udp_send(pvVar4,puVar3,auStack_198,1,puVar5,sv_send_cb);
      if (iVar1 == 0) {
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return 0;
      }
      goto LAB_001869b9;
    }
    if (puVar5 == (uv_udp_t *)0x0) {
      return extraout_EAX;
    }
  }
  iVar1 = (int)puVar7;
  sv_recv_cb_cold_9();
  if (puVar5 == (uv_udp_t *)0x0) {
    cl_send_cb_cold_4();
LAB_00186a16:
    cl_send_cb_cold_1();
LAB_00186a1b:
    cl_send_cb_cold_2();
  }
  else {
    if (iVar1 != 0) goto LAB_00186a16;
    puVar5 = (uv_udp_t *)(puVar5->u).reserved[2];
    if (puVar5 != &client && puVar5 != &server) goto LAB_00186a1b;
    iVar1 = 0x186aba;
    iVar2 = uv_udp_recv_start(puVar5,cl_alloc_cb,cl_recv_cb);
    if (iVar2 == 0) {
      cl_send_cb_called = cl_send_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  cl_send_cb_cold_3();
  if (puVar5 == (uv_udp_t *)0x0) {
    sv_send_cb_cold_3();
    puVar7 = puVar5;
  }
  else {
    puVar7 = puVar5;
    if (iVar1 == 0) {
      puVar7 = (uv_udp_t *)(puVar5->u).reserved[2];
      if (puVar7 == &client || puVar7 == &server) {
        uv_close(puVar7,close_cb);
        free(puVar5);
        sv_send_cb_called = sv_send_cb_called + 1;
        return extraout_EAX_01;
      }
      goto LAB_00186a7a;
    }
  }
  sv_send_cb_cold_1();
LAB_00186a7a:
  sv_send_cb_cold_2();
  if (puVar7 == &client || puVar7 == &server) {
    iVar1 = uv_is_closing();
    if (iVar1 == 1) {
      close_cb_called = close_cb_called + 1;
      return extraout_EAX_02;
    }
  }
  else {
    close_cb_cold_1();
  }
  close_cb_cold_2();
  return extraout_EAX_03;
}

Assistant:

TEST_IMPL(udp_alloc_cb_fail) {
  struct sockaddr_in addr;
  uv_udp_send_t req;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, sv_alloc_cb, sv_recv_cb);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  buf = uv_buf_init("PING", 4);
  r = uv_udp_send(&req,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  cl_send_cb);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_send_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);
  ASSERT(sv_recv_cb_called == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_send_cb_called == 1);
  ASSERT(cl_recv_cb_called == 1);
  ASSERT(sv_send_cb_called == 1);
  ASSERT(sv_recv_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}